

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptString::Concat(JavascriptString *pstLeft,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  char16 *pcVar5;
  uint lenLeft;
  char16_t *pcVar6;
  
  if (pstLeft == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x228,"(pstLeft != nullptr)","Must have a valid left string");
    if (!bVar2) goto LAB_00bbb164;
    *puVar3 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x229,"(pstRight != nullptr)","Must have a valid right string");
    if (!bVar2) {
LAB_00bbb164:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((pstLeft->m_pszValue).ptr == (char16_t *)0x0) {
    bVar2 = VarIsImpl<Js::CompoundString>(&pstLeft->super_RecyclableObject);
    if (bVar2) {
      pJVar4 = Concat_Compound(pstLeft,pstRight);
      return pJVar4;
    }
    if ((pstLeft->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject == (_func_int **)VirtualTableInfo<Js::ConcatString>::Address) {
      pJVar4 = Concat_ConcatToCompound(pstLeft,pstRight);
      return pJVar4;
    }
    lenLeft = pstLeft->m_charLength;
  }
  else {
    lenLeft = pstLeft->m_charLength;
    if ((lenLeft == 0) || (pstRight->m_charLength == 0)) {
      pJVar4 = Concat_OneEmpty(pstLeft,pstRight);
      return pJVar4;
    }
  }
  if (pstRight->m_charLength != 1 || lenLeft != 1) {
    StringProfiler::RecordConcatenation
              ((((((pstLeft->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,lenLeft,pstRight->m_charLength,
               ConcatType_ConcatTree);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
    if (bVar2) {
      pcVar6 = L"...";
      if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
        pcVar5 = L"";
      }
      else {
        pcVar5 = GetString(pstRight);
        if (((pstRight->m_pszValue).ptr != (char16_t *)0x0) &&
           (pcVar6 = L"", 8 < pstRight->m_charLength)) {
          pcVar6 = L"...";
        }
      }
      Output::Print(L"JavascriptString::Concat(\"%.8s%s\") - creating ConcatString\n",pcVar5,pcVar6)
      ;
      Output::Flush();
    }
    pJVar4 = (JavascriptString *)ConcatString::New(pstLeft,pstRight);
    return pJVar4;
  }
  pJVar4 = Concat_BothOneChar(pstLeft,pstRight);
  return pJVar4;
}

Assistant:

JavascriptString* JavascriptString::Concat(JavascriptString* pstLeft, JavascriptString* pstRight)
    {
        AssertMsg(pstLeft != nullptr, "Must have a valid left string");
        AssertMsg(pstRight != nullptr, "Must have a valid right string");

        if(!pstLeft->IsFinalized())
        {
            if(VarIs<CompoundString>(pstLeft))
            {
                return Concat_Compound(pstLeft, pstRight);
            }

            if(VirtualTableInfo<ConcatString>::HasVirtualTable(pstLeft))
            {
                return Concat_ConcatToCompound(pstLeft, pstRight);
            }
        }
        else if(pstLeft->GetLength() == 0 || pstRight->GetLength() == 0)
        {
            return Concat_OneEmpty(pstLeft, pstRight);
        }

        if(pstLeft->GetLength() != 1 || pstRight->GetLength() != 1)
        {
#ifdef PROFILE_STRINGS
            StringProfiler::RecordConcatenation(pstLeft->GetScriptContext(), pstLeft->GetLength(), pstRight->GetLength(), ConcatType_ConcatTree);
#endif
            if(PHASE_TRACE_StringConcat)
            {
                Output::Print(
                    _u("JavascriptString::Concat(\"%.8s%s\") - creating ConcatString\n"),
                    pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                    !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
                Output::Flush();
            }

            return ConcatString::New(pstLeft, pstRight);
        }

        return Concat_BothOneChar(pstLeft, pstRight);
    }